

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

void __thiscall despot::EvalLog::Save(EvalLog *this)

{
  pointer pbVar1;
  ostream *poVar2;
  long lVar3;
  int i;
  ulong uVar4;
  ofstream fout;
  
  std::ofstream::ofstream(&fout,(this->log_file_)._M_dataplus._M_p,_S_out);
  poVar2 = std::ostream::_M_insert<long>((long)&fout);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&fout);
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar3 = 0;
  for (uVar4 = 0;
      pbVar1 = (this->runned_instances).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->runned_instances).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar4 = uVar4 + 1) {
    poVar2 = std::operator<<((ostream *)&fout,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3))
    ;
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,(this->num_of_completed_runs).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar4]);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar3 = lVar3 + 0x20;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&fout);
  return;
}

Assistant:

void EvalLog::Save() {
	ofstream fout(log_file_.c_str(), ofstream::out);
	fout << start_time << endl;
	fout << runned_instances.size() << endl;
	for (int i = 0; i < runned_instances.size(); i++)
		fout << runned_instances[i] << " " << num_of_completed_runs[i] << endl;
	fout.close();
}